

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mock.hpp
# Opt level: O0

void __thiscall
ut11::Mock<void(std::exception)>::Verify<ut11::Operands::IsAny<std::exception>>
          (Mock<void(std::exception)> *this,size_t line,string *file,
          IsAny<std::exception> *expectations)

{
  string *line_00;
  size_t sVar1;
  Mock<void(std::exception)> local_70 [32];
  string local_50 [40];
  IsAny<std::exception> *local_28;
  IsAny<std::exception> *expectations_local;
  string *file_local;
  size_t line_local;
  Mock<void_(std::exception)> *this_local;
  
  local_28 = expectations;
  expectations_local = (IsAny<std::exception> *)file;
  file_local = (string *)line;
  line_local = (size_t)this;
  sVar1 = detail::MockArgumentHandler<std::exception>::
          CountCalls<ut11::Operands::IsAny<std::exception>>
                    ((MockArgumentHandler<std::exception> *)(this + 0x20));
  line_00 = file_local;
  if (sVar1 == 0) {
    std::__cxx11::string::string(local_50,(string *)file);
    GetVerifyFailMessage_abi_cxx11_(local_70);
    Assert::Fail((size_t)line_00,(string *)local_50,(string *)local_70);
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string(local_50);
  }
  return;
}

Assistant:

void Verify(std::size_t line, std::string file, const Expectations&... expectations) const
		{
			if ( m_argumentHandler.CountCalls(expectations...) == 0 )
				Assert::Fail(line, file, GetVerifyFailMessage());
		}